

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool ON_Extrusion::CleanupPolyCurveProfile(ON_PolyCurve *polycurve)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ON_Curve *pOVar5;
  ON_PolyCurve *this;
  ON_PolyCurve **ppOVar6;
  ON_Curve **ppOVar7;
  byte local_91;
  int local_8c;
  ON_PolyCurve *pOStack_88;
  int j;
  ON_Curve *local_80;
  ON_Curve *old_segment_1;
  ON_PolyCurve *pOStack_70;
  bool rc;
  ON_PolyCurve *new_segment;
  undefined1 local_58 [8];
  ON_SimpleArray<ON_Curve_*> new_segments;
  ON_SimpleArray<ON_PolyCurve_*> new_polycurves;
  ON_Curve *old_segment;
  int old_count;
  int i;
  ON_PolyCurve *polycurve_local;
  
  bVar1 = IsValidPolyCurveProfile(polycurve,(ON_TextLog *)0x0);
  if (!bVar1) {
    iVar2 = ON_PolyCurve::Count(polycurve);
    if (1 < iVar2) {
      for (old_segment._4_4_ = 0; old_segment._4_4_ < iVar2;
          old_segment._4_4_ = old_segment._4_4_ + 1) {
        pOVar5 = ON_PolyCurve::SegmentCurve(polycurve,old_segment._4_4_);
        if (pOVar5 == (ON_Curve *)0x0) {
          polycurve_local._7_1_ = 0;
          goto LAB_004e7617;
        }
        iVar3 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
        if ((iVar3 != 2) &&
           (uVar4 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar5,2),
           (uVar4 & 1) == 0)) {
          polycurve_local._7_1_ = 0;
          goto LAB_004e7617;
        }
      }
      ON_PolyCurve::SynchronizeSegmentDomains(polycurve);
      ON_SimpleArray<ON_PolyCurve_*>::ON_SimpleArray
                ((ON_SimpleArray<ON_PolyCurve_*> *)&new_segments.m_count,(long)iVar2);
      ON_SimpleArray<ON_Curve_*>::ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)local_58,(long)iVar2)
      ;
      pOStack_70 = (ON_PolyCurve *)0x0;
      old_segment_1._7_1_ = 1;
      old_segment._4_4_ = 0;
      do {
        local_91 = 0;
        if (old_segment._4_4_ < iVar2) {
          local_91 = old_segment_1._7_1_;
        }
        if ((local_91 & 1) == 0) goto LAB_004e73b3;
        local_80 = ON_PolyCurve::SegmentCurve(polycurve,old_segment._4_4_);
        uVar4 = (*(local_80->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
        if ((uVar4 & 1) == 0) {
          if (pOStack_70 == (ON_PolyCurve *)0x0) {
            this = (ON_PolyCurve *)operator_new(0x40);
            ON_PolyCurve::ON_PolyCurve(this);
            pOStack_70 = this;
            ON_SimpleArray<ON_PolyCurve_*>::Append
                      ((ON_SimpleArray<ON_PolyCurve_*> *)&new_segments.m_count,
                       &stack0xffffffffffffff90);
            ON_PolyCurve::Append(pOStack_70,local_80);
          }
          else {
            ON_PolyCurve::Append(pOStack_70,local_80);
            iVar3 = ON_PolyCurve::FindNextGap(pOStack_70,0);
            if (iVar3 != 0) {
              old_segment_1._7_1_ = 0;
              goto LAB_004e73b3;
            }
            uVar4 = (*(pOStack_70->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                      [0x34])();
            if ((uVar4 & 1) != 0) {
              pOStack_88 = pOStack_70;
              ON_SimpleArray<ON_Curve_*>::Append
                        ((ON_SimpleArray<ON_Curve_*> *)local_58,
                         (ON_Curve **)&stack0xffffffffffffff78);
              pOStack_70 = (ON_PolyCurve *)0x0;
            }
          }
        }
        else {
          if (pOStack_70 != (ON_PolyCurve *)0x0) goto code_r0x004e728f;
          ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)local_58,&local_80);
        }
        old_segment._4_4_ = old_segment._4_4_ + 1;
      } while( true );
    }
    polycurve_local._7_1_ = 0;
    goto LAB_004e7617;
  }
  (*(polycurve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])
            (polycurve,2);
  goto LAB_004e7613;
code_r0x004e728f:
  old_segment_1._7_1_ = 0;
LAB_004e73b3:
  if (pOStack_70 != (ON_PolyCurve *)0x0) {
    old_segment_1._7_1_ = 0;
  }
  if ((old_segment_1._7_1_ & 1) == 0) {
    for (old_segment._4_4_ = 0;
        iVar2 = ON_SimpleArray<ON_PolyCurve_*>::Count
                          ((ON_SimpleArray<ON_PolyCurve_*> *)&new_segments.m_count),
        old_segment._4_4_ < iVar2; old_segment._4_4_ = old_segment._4_4_ + 1) {
      ppOVar6 = ON_SimpleArray<ON_PolyCurve_*>::operator[]
                          ((ON_SimpleArray<ON_PolyCurve_*> *)&new_segments.m_count,old_segment._4_4_
                          );
      pOStack_70 = *ppOVar6;
      if (pOStack_70 != (ON_PolyCurve *)0x0) {
        local_8c = ON_PolyCurve::Count(pOStack_70);
        while (local_8c = local_8c + -1, -1 < local_8c) {
          ON_PolyCurve::HarvestSegment(pOStack_70,local_8c);
        }
        if (pOStack_70 != (ON_PolyCurve *)0x0) {
          (*(pOStack_70->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
        }
      }
    }
    polycurve_local._7_1_ = 0;
    bVar1 = true;
  }
  else {
    for (old_segment._4_4_ = 0;
        iVar3 = ON_SimpleArray<ON_PolyCurve_*>::Count
                          ((ON_SimpleArray<ON_PolyCurve_*> *)&new_segments.m_count),
        old_segment._4_4_ < iVar3; old_segment._4_4_ = old_segment._4_4_ + 1) {
      ppOVar6 = ON_SimpleArray<ON_PolyCurve_*>::operator[]
                          ((ON_SimpleArray<ON_PolyCurve_*> *)&new_segments.m_count,old_segment._4_4_
                          );
      ON_PolyCurve::RemoveNesting(*ppOVar6);
    }
    while (old_segment._4_4_ = iVar2 + -1, -1 < old_segment._4_4_) {
      ON_PolyCurve::HarvestSegment(polycurve,old_segment._4_4_);
      ON_PolyCurve::Remove(polycurve,old_segment._4_4_);
      iVar2 = old_segment._4_4_;
    }
    for (old_segment._4_4_ = 0;
        iVar2 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)local_58),
        old_segment._4_4_ < iVar2; old_segment._4_4_ = old_segment._4_4_ + 1) {
      ppOVar7 = ON_SimpleArray<ON_Curve_*>::operator[]
                          ((ON_SimpleArray<ON_Curve_*> *)local_58,old_segment._4_4_);
      ON_PolyCurve::Append(polycurve,*ppOVar7);
    }
    bVar1 = false;
  }
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)local_58);
  ON_SimpleArray<ON_PolyCurve_*>::~ON_SimpleArray
            ((ON_SimpleArray<ON_PolyCurve_*> *)&new_segments.m_count);
  if (bVar1) goto LAB_004e7617;
LAB_004e7613:
  polycurve_local._7_1_ = 1;
LAB_004e7617:
  return (bool)(polycurve_local._7_1_ & 1);
}

Assistant:

bool ON_Extrusion::CleanupPolyCurveProfile( ON_PolyCurve& polycurve )
{
  if ( !ON_Extrusion::IsValidPolyCurveProfile(polycurve) )
  {
    // see if we can fix it
    int i;
    const int old_count = polycurve.Count();
    if ( old_count <= 1 )
      return false;

    // make segments 2d 
    for ( i = 0; i < old_count; i++ )
    {
      ON_Curve* old_segment = polycurve.SegmentCurve(i);
      if ( 0 == old_segment )
        return false;
      if ( 2 != old_segment->Dimension() && !old_segment->ChangeDimension(2) )
        return false;
    }

    // make segment domains match the polycurve's m_t[] array
    polycurve.SynchronizeSegmentDomains();

    // make each segment a closed curve
    ON_SimpleArray<ON_PolyCurve*> new_polycurves(old_count);
    ON_SimpleArray<ON_Curve*> new_segments(old_count);
    ON_PolyCurve* new_segment = 0;
    bool rc = true;
    for ( i = 0; i < old_count && rc; i++ )
    {
      ON_Curve* old_segment = polycurve.SegmentCurve(i);
      if ( old_segment->IsClosed() )
      {
        if ( 0 != new_segment )
        {
          rc = false;
          break;
        }
        new_segments.Append(old_segment);
      }
      else if ( 0 == new_segment )
      {
        new_segment = new ON_PolyCurve();
        new_polycurves.Append(new_segment);
        new_segment->Append(old_segment);
      }
      else
      {
        new_segment->Append(old_segment);
        if ( new_segment->FindNextGap(0) )
        {
          rc = false;
          break;
        }
        if ( new_segment->IsClosed() )
        {
          new_segments.Append(new_segment);
          new_segment = 0;
        }
      }
    }

    if ( 0 != new_segment )
    {
      rc = false;
    }

    if ( !rc )
    {
      // unable to fix polycurve. Delete the new stuff we allocated.
      for ( i = 0; i < new_polycurves.Count(); i++ )
      {
        new_segment = new_polycurves[i];
        if ( new_segment )
        {
          for ( int j =  new_segment->Count()-1; j >= 0; j-- )
          {
            new_segment->HarvestSegment(j); // do not delete parts of input polycurve
          }
          delete new_segment;
        }
      }
      return false;
    }

    for ( i = 0; i < new_polycurves.Count(); i++ )
    {
      new_polycurves[i]->RemoveNesting();
    }

    for ( i = old_count-1; i >= 0; i-- )
    {
      polycurve.HarvestSegment(i);
      polycurve.Remove(i);
    }
    for ( i = 0; i < new_segments.Count(); i++ )
    {
      polycurve.Append(new_segments[i]);
    }
  }
  else
  {
    polycurve.ChangeDimension(2);
  }
  return true;
}